

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O2

int Abc_NodeBalanceCone_rec
              (Abc_Obj_t *pNode,Vec_Ptr_t *vSuper,int fFirst,int fDuplicate,int fSelective)

{
  void **ppvVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((*(byte *)(((ulong)pNode & 0xfffffffffffffffe) + 0x14) & 0x20) == 0) {
    if (fFirst == 0) {
      if ((((((ulong)pNode & 1) != 0) || ((*(uint *)&pNode->field_0x14 & 0xf) != 7)) ||
          ((fSelective == 0 && fDuplicate == 0 && (1 < (pNode->vFanouts).nSize)))) ||
         (10000 < vSuper->nSize)) {
        Vec_PtrPush(vSuper,pNode);
        pbVar2 = (byte *)(((ulong)pNode & 0xfffffffffffffffe) + 0x14);
        *pbVar2 = *pbVar2 | 0x20;
        return 0;
      }
    }
    else if (((ulong)pNode & 1) != 0) {
      __assert_fail("!Abc_ObjIsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                    ,0x171,"int Abc_NodeBalanceCone_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
    }
    if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                    ,0x172,"int Abc_NodeBalanceCone_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
    }
    iVar3 = Abc_NodeBalanceCone_rec
                      ((Abc_Obj_t *)
                       ((ulong)(*(uint *)&pNode->field_0x14 >> 10 & 1) ^
                       (ulong)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]),vSuper,0,
                       fDuplicate,fSelective);
    iVar4 = Abc_NodeBalanceCone_rec
                      ((Abc_Obj_t *)
                       ((ulong)(*(uint *)&pNode->field_0x14 >> 0xb & 1) ^
                       (ulong)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]]),vSuper,0,
                       fDuplicate,fSelective);
    uVar5 = 0xffffffff;
    if ((iVar3 != -1) && (iVar4 != -1)) {
      uVar5 = (uint)(iVar3 != 0 || iVar4 != 0);
    }
  }
  else {
    uVar6 = (ulong)(uint)vSuper->nSize;
    if (vSuper->nSize < 1) {
      uVar6 = 0;
    }
    uVar5 = 1;
    uVar7 = 0;
    do {
      if (uVar6 == uVar7) {
        uVar7 = 0;
        do {
          if (uVar6 == uVar7) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                          ,0x167,
                          "int Abc_NodeBalanceCone_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
          }
          ppvVar1 = vSuper->pArray + uVar7;
          uVar7 = uVar7 + 1;
        } while (*ppvVar1 != (void *)((ulong)pNode ^ 1));
        return -1;
      }
      ppvVar1 = vSuper->pArray + uVar7;
      uVar7 = uVar7 + 1;
    } while ((Abc_Obj_t *)*ppvVar1 != pNode);
  }
  return uVar5;
}

Assistant:

int Abc_NodeBalanceCone_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vSuper, int fFirst, int fDuplicate, int fSelective )
{
    int RetValue1, RetValue2, i;
    // check if the node is visited
    if ( Abc_ObjRegular(pNode)->fMarkB )
    {
        // check if the node occurs in the same polarity
        for ( i = 0; i < vSuper->nSize; i++ )
            if ( vSuper->pArray[i] == pNode )
                return 1;
        // check if the node is present in the opposite polarity
        for ( i = 0; i < vSuper->nSize; i++ )
            if ( vSuper->pArray[i] == Abc_ObjNot(pNode) )
                return -1;
        assert( 0 );
        return 0;
    }
    // if the new node is complemented or a PI, another gate begins
    if ( !fFirst && (Abc_ObjIsComplement(pNode) || !Abc_ObjIsNode(pNode) || (!fDuplicate && !fSelective && (Abc_ObjFanoutNum(pNode) > 1)) || Vec_PtrSize(vSuper) > 10000) )
    {
        Vec_PtrPush( vSuper, pNode );
        Abc_ObjRegular(pNode)->fMarkB = 1;
        return 0;
    }
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    // go through the branches
    RetValue1 = Abc_NodeBalanceCone_rec( Abc_ObjChild0(pNode), vSuper, 0, fDuplicate, fSelective );
    RetValue2 = Abc_NodeBalanceCone_rec( Abc_ObjChild1(pNode), vSuper, 0, fDuplicate, fSelective );
    if ( RetValue1 == -1 || RetValue2 == -1 )
        return -1;
    // return 1 if at least one branch has a duplicate
    return RetValue1 || RetValue2;
}